

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O3

void expand_2s_i32(TCGContext_conflict9 *tcg_ctx,uint32_t dofs,uint32_t aofs,uint32_t oprsz,
                  TCGv_i32 c,_Bool scalar_first,
                  _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_conflict9 *fni)

{
  TCGTemp *a1;
  TCGTemp *a1_00;
  TCGv_i32 pTVar1;
  TCGv_i32 pTVar2;
  uintptr_t o;
  TCGv_i32 pTVar3;
  uintptr_t o_1;
  uint uVar4;
  
  uVar4 = 0;
  a1 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
  pTVar3 = (TCGv_i32)((long)a1 - (long)tcg_ctx);
  a1_00 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
  if (oprsz != 0) {
    do {
      tcg_gen_op3_tricore(tcg_ctx,INDEX_op_ld_i32,(TCGArg)a1,
                          (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(aofs + uVar4));
      pTVar1 = c;
      pTVar2 = pTVar3;
      if (scalar_first) {
        pTVar1 = pTVar3;
        pTVar2 = c;
      }
      (*fni)(tcg_ctx,(TCGv_i32)((long)a1_00 - (long)tcg_ctx),pTVar2,pTVar1);
      tcg_gen_op3_tricore(tcg_ctx,INDEX_op_st_i32,(TCGArg)a1_00,
                          (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(dofs + uVar4));
      uVar4 = uVar4 + 4;
    } while (uVar4 < oprsz);
  }
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
  tcg_temp_free_internal_tricore
            (tcg_ctx,(TCGTemp *)((TCGv_i32)((long)a1_00 - (long)tcg_ctx) + (long)tcg_ctx));
  return;
}

Assistant:

static void expand_2s_i32(TCGContext *tcg_ctx, uint32_t dofs, uint32_t aofs, uint32_t oprsz,
                          TCGv_i32 c, bool scalar_first,
                          void (*fni)(TCGContext *, TCGv_i32, TCGv_i32, TCGv_i32))
{
    TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
    uint32_t i;

    for (i = 0; i < oprsz; i += 4) {
        tcg_gen_ld_i32(tcg_ctx, t0, tcg_ctx->cpu_env, aofs + i);
        if (scalar_first) {
            fni(tcg_ctx, t1, c, t0);
        } else {
            fni(tcg_ctx, t1, t0, c);
        }
        tcg_gen_st_i32(tcg_ctx, t1, tcg_ctx->cpu_env, dofs + i);
    }
    tcg_temp_free_i32(tcg_ctx, t0);
    tcg_temp_free_i32(tcg_ctx, t1);
}